

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

QRect __thiscall QMenuPrivate::rect(QMenuPrivate *this)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  long lVar5;
  QWidget *this_00;
  int iVar6;
  int iVar7;
  int iVar8;
  QStyle *pQVar9;
  long in_FS_OFFSET;
  QRect QVar10;
  QRect QVar11;
  QStyleOption opt;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar9 = QWidget::style(this_00);
  opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption(&opt,0,0);
  QStyleOption::initFrom(&opt,this_00);
  iVar6 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x1c,&opt,this_00);
  iVar7 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x1d,&opt,this_00);
  iVar8 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x1e,&opt,this_00);
  QVar10 = QWidget::rect(this_00);
  sVar1 = (this->super_QWidgetPrivate).leftmargin;
  sVar2 = (this->super_QWidgetPrivate).topmargin;
  sVar3 = (this->super_QWidgetPrivate).rightmargin;
  sVar4 = (this->super_QWidgetPrivate).bottommargin;
  QStyleOption::~QStyleOption(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    QVar11.x2.m_i = QVar10.x2.m_i.m_i - (iVar6 + iVar8 + (int)sVar3);
    QVar11.y1.m_i = (int)sVar2 + QVar10.y1.m_i.m_i + iVar7 + iVar8;
    QVar11.x1.m_i = (int)sVar1 + QVar10.x1.m_i.m_i + iVar6 + iVar8;
    QVar11.y2.m_i = QVar10.y2.m_i.m_i - (iVar7 + iVar8 + (int)sVar4);
    return QVar11;
  }
  __stack_chk_fail();
}

Assistant:

QRect QMenuPrivate::rect() const
{
    Q_Q(const QMenu);
    QStyle *style = q->style();
    QStyleOption opt(0);
    opt.initFrom(q);
    const int hmargin = style->pixelMetric(QStyle::PM_MenuHMargin, &opt, q);
    const int vmargin = style->pixelMetric(QStyle::PM_MenuVMargin, &opt, q);
    const int fw = style->pixelMetric(QStyle::PM_MenuPanelWidth, &opt, q);
    return (q->rect().adjusted(hmargin + fw + leftmargin, vmargin + fw + topmargin,
                               -(hmargin + fw + rightmargin), -(vmargin + fw + bottommargin)));
}